

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

ArrayBuffer *
Js::ArrayBuffer::NewFromDetachedState(DetachedStateBase *state,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ArrayBuffer *pAVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  
  switch(*(undefined4 *)&state[1].hasBeenClaimed) {
  case 0:
  case 2:
    pAVar4 = JavascriptLibrary::CreateArrayBuffer
                       (library,(RefCountedBuffer *)state[1]._vptr_DetachedStateBase,state[1].typeId
                       );
    return pAVar4;
  case 1:
    pAVar4 = JavascriptLibrary::CreateProjectionArraybuffer
                       (library,(RefCountedBuffer *)state[1]._vptr_DetachedStateBase,state[1].typeId
                       );
    return pAVar4;
  case 3:
    iVar3 = (*state->_vptr_DetachedStateBase[7])();
    return (ArrayBuffer *)CONCAT44(extraout_var,iVar3);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                              ,0x41,"(false)",
                              "Unknown allocationType of ArrayBufferDetachedStateBase ");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
  return (ArrayBuffer *)0x0;
}

Assistant:

ArrayBuffer* ArrayBuffer::NewFromDetachedState(DetachedStateBase* state, JavascriptLibrary *library)
    {
        ArrayBufferDetachedStateBase* arrayBufferState = (ArrayBufferDetachedStateBase *)state;
        ArrayBuffer *toReturn = nullptr;

        switch (arrayBufferState->allocationType)
        {
        case ArrayBufferAllocationType::CoTask:
            toReturn = library->CreateProjectionArraybuffer(arrayBufferState->buffer, arrayBufferState->bufferLength);
            break;
        case ArrayBufferAllocationType::Heap:
        case ArrayBufferAllocationType::MemAlloc:
            toReturn = library->CreateArrayBuffer(arrayBufferState->buffer, arrayBufferState->bufferLength);
            break;
        case ArrayBufferAllocationType::External:
            toReturn = static_cast<ExternalArrayBufferDetachedState*>(state)->Create(library);
            break;
        default:
            AssertMsg(false, "Unknown allocationType of ArrayBufferDetachedStateBase ");
        }

        return toReturn;
    }